

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthCountOnesInCofsSlow(uint *pTruth,int nVars,int *pStore,uint *pAux)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  if (0 < nVars) {
    uVar1 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar1 = 1;
    }
    uVar5 = 0;
    do {
      Kit_TruthCofactor0New(pAux,pTruth,nVars,(int)uVar5);
      iVar2 = 0;
      if (0 < (int)uVar1) {
        iVar2 = 0;
        lVar3 = (ulong)uVar1 + 1;
        do {
          uVar4 = (pAux[lVar3 + -2] >> 1 & 0x55555555) + (pAux[lVar3 + -2] & 0x55555555);
          uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
          uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
          uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
          iVar2 = iVar2 + (uVar4 >> 0x10) + (uVar4 & 0xffff);
          lVar3 = lVar3 + -1;
        } while (1 < lVar3);
        iVar2 = iVar2 / 2;
      }
      pStore[uVar5 * 2] = iVar2;
      Kit_TruthCofactor1New(pAux,pTruth,nVars,(int)uVar5);
      if ((int)uVar1 < 1) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        lVar3 = (ulong)uVar1 + 1;
        do {
          uVar4 = (pAux[lVar3 + -2] >> 1 & 0x55555555) + (pAux[lVar3 + -2] & 0x55555555);
          uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
          uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
          uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
          iVar2 = iVar2 + (uVar4 >> 0x10) + (uVar4 & 0xffff);
          lVar3 = lVar3 + -1;
        } while (1 < lVar3);
        iVar2 = iVar2 / 2;
      }
      pStore[uVar5 * 2 + 1] = iVar2;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nVars);
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofsSlow( unsigned * pTruth, int nVars, int * pStore, unsigned * pAux )
{
    int i;
    for ( i = 0; i < nVars; i++ )
    {
        Kit_TruthCofactor0New( pAux, pTruth, nVars, i );
        pStore[2*i+0] = Kit_TruthCountOnes( pAux, nVars ) / 2;
        Kit_TruthCofactor1New( pAux, pTruth, nVars, i );
        pStore[2*i+1] = Kit_TruthCountOnes( pAux, nVars ) / 2;
    }
}